

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O1

bool ppmb_read_data(ifstream *input,int xsize,int ysize,uchar *r,uchar *g,uchar *b)

{
  ostream *poVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char c;
  uchar local_42;
  byte local_41;
  int local_40;
  uint local_3c;
  ulong local_38;
  
  local_41 = 0 < ysize;
  if (0 < ysize) {
    local_38 = 0;
    local_40 = xsize;
    local_3c = ysize;
    do {
      if (0 < local_40) {
        iVar3 = 0;
        do {
          std::istream::read((char *)input,(long)&local_42);
          if (r == (uchar *)0x0) {
            r = (uchar *)0x0;
          }
          else {
            *r = local_42;
            r = r + 1;
          }
          if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
            pcVar4 = "  End of file reading R byte of pixel (";
LAB_00105626:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"PPMB_READ_DATA - Fatal error!\n",0x1e);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,0x27);
            poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)local_38);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,") \n",3);
            goto LAB_001056ac;
          }
          std::istream::read((char *)input,(long)&local_42);
          if (g == (uchar *)0x0) {
            g = (uchar *)0x0;
          }
          else {
            *g = local_42;
            g = g + 1;
          }
          if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
            pcVar4 = "  End of file reading G byte of pixel (";
            goto LAB_00105626;
          }
          std::istream::read((char *)input,(long)&local_42);
          if (b == (uchar *)0x0) {
            b = (uchar *)0x0;
          }
          else {
            *b = local_42;
            b = b + 1;
          }
          if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
            pcVar4 = "  End of file reading B byte of pixel (";
            goto LAB_00105626;
          }
          iVar3 = iVar3 + 1;
        } while (local_40 != iVar3);
      }
      uVar2 = (int)local_38 + 1;
      local_38 = (ulong)uVar2;
      local_41 = (int)uVar2 < (int)local_3c;
    } while (uVar2 != local_3c);
  }
LAB_001056ac:
  return (bool)(local_41 & 1);
}

Assistant:

bool ppmb_read_data ( ifstream &input, int xsize, int ysize, 
  unsigned char *r, unsigned char *g, unsigned char *b )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_READ_DATA reads the data in a binary portable pixel map file.
//
//  Discussion:
//
//    If the ordinary ">>" operator is used to input the data, then data that
//    happens to look like new lines or other white space is skipped.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    17 December 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, ifstream &input, a pointer to the file containing the binary
//    portable pixel map data.
//
//    Input, int XSIZE, YSIZE, the number of rows and columns of data.
//
//    Input, unsigned char *R, *G, *B, the arrays of XSIZE by YSIZE 
//    data values.
//
//    Output, bool PPMB_READ_DATA, is true if an error occurred.
//
{
  char c;
  bool error;
  int i;
  unsigned char *indexb;
  unsigned char *indexg;
  unsigned char *indexr;
  int j;
  int k;

  indexr = r;
  indexg = g;
  indexb = b;

  for ( j = 0; j < ysize; j++ )
  {
    for ( i = 0; i < xsize; i++ )
    {
      input.read ( &c, 1 );
	  if (indexr) {
        *indexr = ( unsigned char ) c;
         indexr = indexr + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading R byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

      input.read ( &c, 1 );
	  if (indexg) {
        *indexg = ( unsigned char ) c;
         indexg = indexg + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading G byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

      input.read ( &c, 1 );
	  if (indexb) {
        *indexb = ( unsigned char ) c;
        indexb = indexb + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading B byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

    }
  }
  return false;
}